

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

bool __thiscall
GdlSlotRefExpression::CheckRuleExpression
          (GdlSlotRefExpression *this,GrcFont *param_1,GdlRenderer *param_2,
          vector<bool,_std::allocator<bool>_> *vfLb,vector<bool,_std::allocator<bool>_> *vfIns,
          vector<bool,_std::allocator<bool>_> *vfDel,bool fValue,bool fValueIsInputSlot)

{
  uint uVar1;
  int iVar2;
  _Bit_type *p_Var3;
  uint __val;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string staSlotNumber;
  long *local_160;
  long local_158;
  long local_150 [2];
  vector<bool,_std::allocator<bool>_> *local_140;
  vector<bool,_std::allocator<bool>_> *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar1 = this->m_srNumber;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0015479a;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0015479a;
      }
      if (uVar6 < 10000) goto LAB_0015479a;
      uVar7 = uVar7 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0015479a:
  local_160 = local_150;
  local_140 = vfIns;
  local_138 = vfDel;
  std::__cxx11::string::_M_construct((ulong)&local_160,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_160 + (ulong)(uVar1 >> 0x1f)),__len,__val);
  iVar2 = this->m_srNumber;
  lVar5 = (long)iVar2;
  if ((lVar5 < 1) ||
     (p_Var3 = (vfLb->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p,
     (int)((*(int *)&(vfLb->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (int)p_Var3)
           * 8 + (vfLb->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_offset) < iVar2)) {
    paVar11 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Slot reference out of range: @","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_160,local_158 + (long)local_160);
    GrcErrorList::AddItem
              (&g_errorList,true,0x85e,(GdlObject *)&this->field_0x8,(GrpLineAndFile *)0x0,&local_50
               ,&local_70,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
               (string *)0x0);
    _Var10._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      _Var10._M_p = local_50._M_dataplus._M_p;
    }
  }
  else {
    if (fValue) {
      uVar7 = lVar5 - 1;
      uVar9 = lVar5 + 0x3e;
      if (-1 < (long)uVar7) {
        uVar9 = uVar7;
      }
      if ((p_Var3[((long)uVar9 >> 6) +
                  (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar7 & 0x3f) & 1) != 0) {
        paVar11 = &local_90.field_2;
        local_90._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Illegal reference to line-break slot: @","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_160,local_158 + (long)local_160);
        GrcErrorList::AddItem
                  (&g_errorList,true,0x85f,(GdlObject *)&this->field_0x8,(GrpLineAndFile *)0x0,
                   &local_90,&local_b0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                   (string *)0x0,(string *)0x0);
        _Var10._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          _Var10._M_p = local_90._M_dataplus._M_p;
        }
        goto LAB_001548a7;
      }
    }
    if (!fValue || fValueIsInputSlot) {
      uVar7 = lVar5 - 1;
      uVar9 = lVar5 + 0x3e;
      if (-1 < (long)uVar7) {
        uVar9 = uVar7;
      }
      if (((local_140->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) +
            (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar7 & 0x3f) & 1) == 0) {
        bVar8 = true;
        goto LAB_001548b9;
      }
      paVar11 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Illegal reference to inserted slot: @","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_160,local_158 + (long)local_160);
      GrcErrorList::AddItem
                (&g_errorList,true,0x860,(GdlObject *)&this->field_0x8,(GrpLineAndFile *)0x0,
                 &local_d0,&local_f0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                 (string *)0x0,(string *)0x0);
      _Var10._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        _Var10._M_p = local_d0._M_dataplus._M_p;
      }
    }
    else {
      uVar7 = lVar5 - 1;
      uVar9 = lVar5 + 0x3e;
      if (-1 < (long)uVar7) {
        uVar9 = uVar7;
      }
      if (((local_138->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) +
            (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           ((ulong)(iVar2 - 1U & 0xff) & 0x3f) & 1) == 0) {
        bVar8 = true;
        goto LAB_001548b9;
      }
      paVar11 = &local_110.field_2;
      local_110._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"Illegal reference to deleted slot: @","");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_160,local_158 + (long)local_160);
      GrcErrorList::AddItem
                (&g_errorList,true,0x861,(GdlObject *)&this->field_0x8,(GrpLineAndFile *)0x0,
                 &local_110,&local_130,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                 (string *)0x0,(string *)0x0);
      _Var10._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        _Var10._M_p = local_110._M_dataplus._M_p;
      }
    }
  }
LAB_001548a7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != paVar11) {
    operator_delete(_Var10._M_p,paVar11->_M_allocated_capacity + 1);
  }
  bVar8 = false;
LAB_001548b9:
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  return bVar8;
}

Assistant:

bool GdlSlotRefExpression::CheckRuleExpression(GrcFont * /*pfont*/, GdlRenderer * /*prndr*/,
	std::vector<bool> & vfLb, std::vector<bool> & vfIns, std::vector<bool> & vfDel,
	bool fValue, bool fValueIsInputSlot)
{
	auto const staSlotNumber = std::to_string(m_srNumber);

	if (m_srNumber < 1 || m_srNumber > signed(vfLb.size()))
	{
		g_errorList.AddError(2142, this,
			"Slot reference out of range: @",
			staSlotNumber);
		return false;
	}
	else if (fValue && vfLb[m_srNumber - 1])
	{
		//	Eg, attach.to = @2 or comp.X.ref = @2, where @2 is a LB slot
		g_errorList.AddError(2143, this,
			"Illegal reference to line-break slot: @",
			staSlotNumber);
		return false;
	}
	else if ((!fValue || fValueIsInputSlot) && vfIns[m_srNumber - 1])
	{
		//	Eg, @1.bb.width or comp.X.ref = @1, where @1 is being inserted
		g_errorList.AddError(2144, this,
			"Illegal reference to inserted slot: @",
			staSlotNumber);
		return false;
	}
	else if (fValue && !fValueIsInputSlot && vfDel[m_srNumber - 1])
	{
		//	Eg, attach.to = @3, where @3 is being deleted
		g_errorList.AddError(2145, this,
			"Illegal reference to deleted slot: @",
			staSlotNumber);
		return false;
	}
	else
		return true;
}